

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enterprise.cpp
# Opt level: O0

HalfCycles __thiscall
Enterprise::ConcreteMachine<true,_false>::perform_machine_cycle
          (ConcreteMachine<true,_false> *this,PartialMachineCycle *cycle)

{
  bool bVar1;
  uint8_t uVar2;
  byte bVar3;
  TargetTimeScale TVar4;
  Nick *pNVar5;
  Cycles CVar6;
  WrappedInt<HalfCycles> after_period;
  TimedInterruptSource *this_00;
  IntType l;
  ssize_t sVar7;
  size_type sVar8;
  reference pvVar9;
  pointer pNVar10;
  pointer pTVar11;
  pointer this_01;
  uint *puVar12;
  void *__buf;
  void *__buf_00;
  int iVar13;
  uint local_194;
  LogLine local_188;
  LogLine local_180;
  HalfCycles local_178;
  undefined1 local_170 [24];
  undefined1 local_158 [16];
  LogLine local_148;
  undefined1 local_140 [16];
  undefined1 local_130 [32];
  undefined1 local_110 [16];
  LogLine local_100;
  unique_ptr<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_> local_f8;
  WrappedInt<HalfCycles> local_f0;
  WrappedInt<HalfCycles> local_e8;
  Delegate *local_e0;
  WrappedInt<HalfCycles> local_d8;
  HalfCycles full_length;
  Cycles delay_2;
  TargetTimeScale delay_time_2;
  Cycles delay_1;
  TargetTimeScale delay_time_1;
  Cycles delay;
  TargetTimeScale delay_time;
  uint16_t address;
  PartialMachineCycle *cycle_local;
  ConcreteMachine<true,_false> *this_local;
  HalfCycles penalty;
  
  if (cycle->address == (uint16_t *)0x0) {
    local_194 = 0;
  }
  else {
    local_194 = (uint)*cycle->address;
  }
  HalfCycles::HalfCycles((HalfCycles *)&this_local);
  iVar13 = (int)local_194 >> 0xe;
  switch(cycle->operation) {
  case Write:
    if ((this->is_video_[iVar13] & 1U) != 0) {
      JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::flush(&this->nick_);
    }
  case Read:
    if ((this->is_video_[iVar13] & 1U) != 0) {
      HalfCycles::HalfCycles((HalfCycles *)&delay_1,1);
      TVar4 = JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::time_since_flush
                        (&this->nick_,(HalfCycles)delay_1.super_WrappedInt<Cycles>.length_);
      pNVar5 = JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::last_valid
                         (&this->nick_);
      CVar6 = Nick::get_time_until_z80_slot(pNVar5,(Cycles)TVar4.super_WrappedInt<Cycles>.length_);
      this_local = (ConcreteMachine<true,_false> *)
                   JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::back_map
                             (&this->nick_,(TargetTimeScale)CVar6.super_WrappedInt<Cycles>.length_,
                              TVar4);
    }
    break;
  case Input:
  case Output:
    if ((local_194 & 0xf0) == 0x80) {
      HalfCycles::HalfCycles((HalfCycles *)&delay_2,1);
      after_period.length_ =
           (IntType)JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::
                    time_since_flush(&this->nick_,
                                     (HalfCycles)delay_2.super_WrappedInt<Cycles>.length_);
      pNVar5 = JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::last_valid
                         (&this->nick_);
      CVar6 = Nick::get_time_until_z80_slot(pNVar5,(Cycles)after_period.length_);
      full_length.super_WrappedInt<HalfCycles>.length_ =
           (WrappedInt<HalfCycles>)(WrappedInt<HalfCycles>)after_period.length_;
      this_local = (ConcreteMachine<true,_false> *)
                   JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::back_map
                             (&this->nick_,(TargetTimeScale)CVar6.super_WrappedInt<Cycles>.length_,
                              (TargetTimeScale)after_period.length_);
    }
    break;
  default:
    break;
  case ReadOpcodeStart:
    if ((this->is_video_[iVar13] & 1U) == 0) {
      if (this->wait_mode_ != None) {
        this_local = (ConcreteMachine<true,_false> *)
                     (this->dave_delay_).super_WrappedInt<HalfCycles>.length_;
      }
    }
    else {
      HalfCycles::HalfCycles((HalfCycles *)&delay,2);
      TVar4 = JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::time_since_flush
                        (&this->nick_,(HalfCycles)delay.super_WrappedInt<Cycles>.length_);
      pNVar5 = JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::last_valid
                         (&this->nick_);
      CVar6 = Nick::get_time_until_z80_slot(pNVar5,(Cycles)TVar4.super_WrappedInt<Cycles>.length_);
      this_local = (ConcreteMachine<true,_false> *)
                   JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::back_map
                             (&this->nick_,(TargetTimeScale)CVar6.super_WrappedInt<Cycles>.length_,
                              TVar4);
    }
    break;
  case ReadStart:
  case WriteStart:
    if (((this->is_video_[iVar13] & 1U) == 0) && (this->wait_mode_ == OnAllAccesses)) {
      this_local = (ConcreteMachine<true,_false> *)
                   (this->dave_delay_).super_WrappedInt<HalfCycles>.length_;
    }
  }
  local_d8.length_ =
       (IntType)WrappedInt<HalfCycles>::operator+
                          (&(cycle->length).super_WrappedInt<HalfCycles>,(HalfCycles *)&this_local);
  WrappedInt<HalfCycles>::operator+=
            (&(this->time_since_audio_update_).super_WrappedInt<HalfCycles>,(HalfCycles *)&local_d8)
  ;
  local_e0 = (Delegate *)local_d8.length_;
  advance_nick(this,(HalfCycles)local_d8.length_);
  local_e8.length_ = local_d8.length_;
  bVar1 = JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::operator+=
                    (&this->dave_timer_,(HalfCycles)local_d8.length_);
  if (bVar1) {
    this_00 = JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::last_valid
                        (&this->dave_timer_);
    uVar2 = Dave::TimedInterruptSource::get_new_interrupts(this_00);
    local_f0.length_ =
         (IntType)JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::
                  last_sequence_point_overrun(&this->dave_timer_);
    set_interrupts(this,uVar2,(HalfCycles)local_f0.length_);
  }
  l = WrappedInt<HalfCycles>::as_integral(&local_d8);
  Cycles::Cycles((Cycles *)&local_f8,l);
  WD::WD1770::run_for(&(this->exdos_).super_WD1770,
                      (Cycles)local_f8._M_t.
                              super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
                              .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl);
  switch(cycle->operation) {
  case ReadOpcode:
  case Read:
    if (this->read_pointers_[iVar13] == (uint8_t *)0x0) {
      *cycle->value = 0xff;
    }
    else {
      *cycle->value = this->read_pointers_[iVar13][(ushort)local_194];
    }
    break;
  case Write:
    if (this->write_pointers_[iVar13] != (uint8_t *)0x0) {
      this->write_pointers_[iVar13][(ushort)local_194] = *cycle->value;
    }
    break;
  case Input:
    puVar12 = &switchD_00744ffa::switchdataD_00a5244c;
    switch(local_194 & 0xff) {
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
      sVar7 = WD::WD1770::read(&(this->exdos_).super_WD1770,local_194,__buf,0xa5244c);
      *cycle->value = (uint8_t)sVar7;
      break;
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
      uVar2 = EXDos::get_control_register(&this->exdos_);
      *cycle->value = uVar2;
      break;
    default:
      Log::Logger<(Log::Source)12>::error((Logger<(Log::Source)12> *)&local_100);
      Log::Logger<(Log::Source)12>::LogLine::append
                (&local_100,"Unhandled input from %02x",(ulong)(local_194 & 0xff));
      Log::Logger<(Log::Source)12>::LogLine::~LogLine(&local_100);
      *cycle->value = 0xff;
      break;
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x83:
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
    case 0x88:
    case 0x89:
    case 0x8a:
    case 0x8b:
    case 0x8c:
    case 0x8d:
    case 0x8e:
    case 0x8f:
      iVar13 = (int)this + 0x60500;
      JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::operator->
                ((JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000> *)local_110);
      pNVar10 = std::
                unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
                ::operator->((unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
                              *)local_110);
      sVar7 = Nick::read(pNVar10,iVar13,__buf_00,(size_t)puVar12);
      *cycle->value = (uint8_t)sVar7;
      std::
      unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
                     *)local_110);
      break;
    case 0xb0:
      *cycle->value = this->pages_[0];
      break;
    case 0xb1:
      *cycle->value = this->pages_[1];
      break;
    case 0xb2:
      *cycle->value = this->pages_[2];
      break;
    case 0xb3:
      *cycle->value = this->pages_[3];
      break;
    case 0xb4:
      JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::operator->
                ((JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000> *)local_130);
      pNVar10 = std::
                unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
                ::operator->((unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
                              *)local_130);
      bVar1 = Nick::get_interrupt_line(pNVar10);
      JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::operator->
                ((JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8> *)
                 local_140);
      pTVar11 = std::
                unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
                ::operator->((unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
                              *)local_140);
      bVar3 = Dave::TimedInterruptSource::get_divider_state(pTVar11);
      *cycle->value = bVar1 << 4 | bVar3 | this->interrupt_state_;
      std::
      unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
                     *)local_140);
      std::
      unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
                     *)local_130);
      break;
    case 0xb5:
      bVar3 = this->active_key_line_;
      sVar8 = std::array<unsigned_char,_10UL>::size(&this->key_lines_);
      if (bVar3 < sVar8) {
        pvVar9 = std::array<unsigned_char,_10UL>::operator[]
                           (&this->key_lines_,(ulong)this->active_key_line_);
        *cycle->value = *pvVar9;
      }
      else {
        *cycle->value = 0xff;
      }
      break;
    case 0xb6:
      *cycle->value = 0xff;
    }
    break;
  case Output:
    puVar12 = &switchD_00745333::switchdataD_00a5218c;
    switch(local_194 & 0xff) {
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
      WD::WD1770::write(&(this->exdos_).super_WD1770,local_194,(void *)(ulong)*cycle->value,0xa5218c
                       );
      break;
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
      EXDos::set_control_register(&this->exdos_,*cycle->value);
      break;
    default:
      Log::Logger<(Log::Source)12>::error((Logger<(Log::Source)12> *)&local_148);
      Log::Logger<(Log::Source)12>::LogLine::append
                (&local_148,"Unhandled output: %02x to %02x",(ulong)*cycle->value,
                 (ulong)(local_194 & 0xff));
      Log::Logger<(Log::Source)12>::LogLine::~LogLine(&local_148);
      break;
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x83:
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
    case 0x88:
    case 0x89:
    case 0x8a:
    case 0x8b:
    case 0x8c:
    case 0x8d:
    case 0x8e:
    case 0x8f:
      JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::operator->
                ((JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000> *)local_158);
      pNVar10 = std::
                unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
                ::operator->((unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
                              *)local_158);
      Nick::write(pNVar10,local_194,(void *)(ulong)*cycle->value,(size_t)puVar12);
      std::
      unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
                     *)local_158);
      break;
    case 0xb0:
      ConcreteMachine<true,false>::page<0ul>((ConcreteMachine<true,false> *)this,*cycle->value);
      break;
    case 0xb1:
      ConcreteMachine<true,false>::page<1ul>((ConcreteMachine<true,false> *)this,*cycle->value);
      break;
    case 0xb2:
      ConcreteMachine<true,false>::page<2ul>((ConcreteMachine<true,false> *)this,*cycle->value);
      break;
    case 0xb3:
      ConcreteMachine<true,false>::page<3ul>((ConcreteMachine<true,false> *)this,*cycle->value);
      break;
    case 0xb4:
      this->interrupt_mask_ = *cycle->value & 0x55;
      this->interrupt_state_ = this->interrupt_state_ & (*cycle->value ^ 0xff);
      HalfCycles::HalfCycles(&local_178,0);
      update_interrupts(this,local_178);
      break;
    case 0xb5:
      if (((this->active_key_line_ == '\t') && ((*cycle->value & 0xf) == 0)) &&
         (((this->should_skip_splash_screen_ & 1U) != 0 ||
          (bVar1 = std::unique_ptr::operator_cast_to_bool
                             ((unique_ptr *)
                              &(this->super_TypeRecipient<Enterprise::CharacterMapper>).typer_),
          bVar1)))) {
        if ((this->should_skip_splash_screen_ & 1U) == 0) {
          if (this->typer_delay_ == 0) {
            this_01 = std::unique_ptr<Utility::Typer,_std::default_delete<Utility::Typer>_>::
                      operator->(&(this->super_TypeRecipient<Enterprise::CharacterMapper>).typer_);
            bVar1 = Utility::Typer::type_next_character(this_01);
            if (!bVar1) {
              clear_all_keys(this);
              std::unique_ptr<Utility::Typer,_std::default_delete<Utility::Typer>_>::operator=
                        (&(this->super_TypeRecipient<Enterprise::CharacterMapper>).typer_,
                         (nullptr_t)0x0);
            }
          }
          else {
            this->typer_delay_ = this->typer_delay_ + -1;
          }
        }
        else {
          set_key_state(this,0x840,this->typer_delay_ != 0);
          if (this->typer_delay_ == 0) {
            this->typer_delay_ = 0x3c;
            this->should_skip_splash_screen_ = false;
          }
          else {
            this->typer_delay_ = this->typer_delay_ + -1;
          }
        }
      }
      this->active_key_line_ = *cycle->value & 0xf;
      break;
    case 0xb6:
      Log::Logger<(Log::Source)12>::info((Logger<(Log::Source)12> *)&local_180);
      Log::Logger<(Log::Source)12>::LogLine::append
                (&local_180,"TODO: printer output: %02x",(ulong)*cycle->value);
      Log::Logger<(Log::Source)12>::LogLine::~LogLine(&local_180);
      break;
    case 0xb7:
      Log::Logger<(Log::Source)12>::info((Logger<(Log::Source)12> *)&local_188);
      Log::Logger<(Log::Source)12>::LogLine::append
                (&local_188,"TODO: serial output: %02x",(ulong)*cycle->value);
      Log::Logger<(Log::Source)12>::LogLine::~LogLine(&local_188);
      break;
    case 0xbf:
      bVar3 = *cycle->value >> 2;
      if ((bVar3 & 3) == 0) {
        this->wait_mode_ = OnAllAccesses;
      }
      else if ((bVar3 & 3) == 1) {
        this->wait_mode_ = OnM1;
      }
      else {
        this->wait_mode_ = None;
      }
      HalfCycles::HalfCycles((HalfCycles *)(local_170 + 0x10),(long)(int)((*cycle->value & 2) + 2));
      (this->dave_delay_).super_WrappedInt<HalfCycles>.length_ = local_170._16_8_;
      puVar12 = (uint *)local_170._16_8_;
    case 0xa0:
    case 0xa1:
    case 0xa2:
    case 0xa3:
    case 0xa4:
    case 0xa5:
    case 0xa6:
    case 0xa7:
    case 0xa8:
    case 0xa9:
    case 0xaa:
    case 0xab:
    case 0xac:
    case 0xad:
    case 0xae:
    case 0xaf:
      update_audio(this);
      Dave::Audio::write(&this->dave_audio_,local_194,(void *)(ulong)*cycle->value,(size_t)puVar12);
      JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::operator->
                ((JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8> *)
                 local_170);
      pTVar11 = std::
                unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
                ::operator->((unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
                              *)local_170);
      Dave::TimedInterruptSource::write
                (pTVar11,local_194,(void *)(ulong)*cycle->value,(size_t)puVar12);
      std::
      unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
                     *)local_170);
    }
    break;
  case Interrupt:
    *cycle->value = 0xff;
  }
  return (HalfCycles)(WrappedInt<HalfCycles>)this_local;
}

Assistant:

forceinline HalfCycles perform_machine_cycle(const CPU::Z80::PartialMachineCycle &cycle) {
			using PartialMachineCycle = CPU::Z80::PartialMachineCycle;
			const uint16_t address = cycle.address ? *cycle.address : 0x0000;

			// Calculate an access penalty, if applicable.
			//
			// Rule applied here, which is slightly inferred:
			//
			//	Non-video reads and writes are delayed by exactly a cycle or not delayed at all,
			//	depending on the programmer's configuration of Dave.
			//
			//	Video reads and writes, and Nick port accesses, are delayed so that the last
			//	clock cycle of the machine cycle falls wholly inside the designated Z80 access
			//	window, per Nick.
			//
			// The switch statement below just attempts to implement that logic.
			//
			HalfCycles penalty;
			switch(cycle.operation) {
				default: break;

				// For non-video pauses, insert during the initial part of the bus cycle.
				case PartialMachineCycle::ReadStart:
				case PartialMachineCycle::WriteStart:
					if(!is_video_[address >> 14] && wait_mode_ == WaitMode::OnAllAccesses) {
						penalty = dave_delay_;
					}
				break;
				case PartialMachineCycle::ReadOpcodeStart: {
					if(is_video_[address >> 14]) {
						// Query Nick for the amount of delay that would occur with one cycle left
						// in this read opcode.
						const auto delay_time = nick_.time_since_flush(HalfCycles(2));
						const auto delay = nick_.last_valid()->get_time_until_z80_slot(delay_time);
						penalty = nick_.back_map(delay, delay_time);
					} else if(wait_mode_ != WaitMode::None) {
						penalty = dave_delay_;
					}
				} break;

				// Video pauses: insert right at the end of the bus cycle.
				case PartialMachineCycle::Write:
					// Ensure all video that should have been collected prior to
					// this write has been.
					if(is_video_[address >> 14]) {
						nick_.flush();
					}
					[[fallthrough]];

				case PartialMachineCycle::Read:
					if(is_video_[address >> 14]) {
						// Get delay, in Nick cycles, for a Z80 access that occurs in 0.5
						// cycles from now (i.e. with one cycle left to run).
						const auto delay_time = nick_.time_since_flush(HalfCycles(1));
						const auto delay = nick_.last_valid()->get_time_until_z80_slot(delay_time);
						penalty = nick_.back_map(delay, delay_time);
					}
				break;

				case PartialMachineCycle::Input:
				case PartialMachineCycle::Output: {
					if((address & 0xf0) == 0x80) {
						// Get delay, in Nick cycles, for a Z80 access that occurs in 0.5
						// cycles from now (i.e. with one cycle left to run).
						const auto delay_time = nick_.time_since_flush(HalfCycles(1));
						const auto delay = nick_.last_valid()->get_time_until_z80_slot(delay_time);
						penalty = nick_.back_map(delay, delay_time);
					}
				}
			}

			const HalfCycles full_length = cycle.length + penalty;
			time_since_audio_update_ += full_length;
			advance_nick(full_length);
			if(dave_timer_ += full_length) {
				set_interrupts(dave_timer_.last_valid()->get_new_interrupts(), dave_timer_.last_sequence_point_overrun());
			}

			// The WD/etc runs at a nominal 8Mhz.
			if constexpr (has_disk_controller) {
				exdos_.run_for(Cycles(full_length.as_integral()));
			}

			switch(cycle.operation) {
				default: break;

				case PartialMachineCycle::Interrupt:
					*cycle.value = 0xff;
				break;

				case PartialMachineCycle::Input:
					switch(address & 0xff) {
						default:
							logger.error().append("Unhandled input from %02x", address & 0xff);
							*cycle.value = 0xff;
						break;

						case 0x10:	case 0x11:	case 0x12:	case 0x13:
						case 0x14:	case 0x15:	case 0x16:	case 0x17:
							if constexpr (has_disk_controller) {
								*cycle.value = exdos_.read(address);
							} else {
								*cycle.value = 0xff;
							}
						break;
						case 0x18:	case 0x19:	case 0x1a:	case 0x1b:
						case 0x1c:	case 0x1d:	case 0x1e:	case 0x1f:
							if constexpr (has_disk_controller) {
								*cycle.value = exdos_.get_control_register();
							} else {
								*cycle.value = 0xff;
							}
						break;

						case 0x80:	case 0x81:	case 0x82:	case 0x83:
						case 0x84:	case 0x85:	case 0x86:	case 0x87:
						case 0x88:	case 0x89:	case 0x8a:	case 0x8b:
						case 0x8c:	case 0x8d:	case 0x8e:	case 0x8f:
							*cycle.value = nick_->read();
						break;

						case 0xb0:	*cycle.value = pages_[0];	break;
						case 0xb1:	*cycle.value = pages_[1];	break;
						case 0xb2:	*cycle.value = pages_[2];	break;
						case 0xb3:	*cycle.value = pages_[3];	break;

						case 0xb4:
							*cycle.value =
								(nick_->get_interrupt_line() ? 0x10 : 0x00) |
								dave_timer_->get_divider_state() |
								interrupt_state_;
						break;
						case 0xb5:
							if(active_key_line_ < key_lines_.size()) {
								*cycle.value = key_lines_[active_key_line_];
							} else {
								*cycle.value = 0xff;
							}
						break;
						case 0xb6: {
							// TODO: selected keyboard row, 0 to 9, should return one bit of joystick
							// input. That being the case:
							//
							//	b0:		joystick input
							//	b1, b2:	unused (in theory read from control port, but not used by any hardware)
							//	b3:		0 = printer ready; 1 = not ready
							//	b4:		serial, data in
							//	b5:		serial, status in
							//	b6:		tape input volume level, 0 = high, 1 = low
							//	b7:		tape data input
							*cycle.value = 0xff;
						} break;
					}
				break;

				case PartialMachineCycle::Output:
					switch(address & 0xff) {
						default:
							logger.error().append("Unhandled output: %02x to %02x", *cycle.value, address & 0xff);
						break;

						case 0x10:	case 0x11:	case 0x12:	case 0x13:
						case 0x14:	case 0x15:	case 0x16:	case 0x17:
							if constexpr(has_disk_controller) {
								exdos_.write(address, *cycle.value);
							}
						break;
						case 0x18:	case 0x19:	case 0x1a:	case 0x1b:
						case 0x1c:	case 0x1d:	case 0x1e:	case 0x1f:
							if constexpr(has_disk_controller) {
								exdos_.set_control_register(*cycle.value);
							}
						break;

						case 0x80:	case 0x81:	case 0x82:	case 0x83:
						case 0x84:	case 0x85:	case 0x86:	case 0x87:
						case 0x88:	case 0x89:	case 0x8a:	case 0x8b:
						case 0x8c:	case 0x8d:	case 0x8e:	case 0x8f:
							nick_->write(address, *cycle.value);
						break;

						case 0xb0:	page<0>(*cycle.value);	break;
						case 0xb1:	page<1>(*cycle.value);	break;
						case 0xb2:	page<2>(*cycle.value);	break;
						case 0xb3:	page<3>(*cycle.value);	break;

						case 0xbf:
							switch((*cycle.value >> 2)&3) {
								default:	wait_mode_ = WaitMode::None;			break;
								case 0:		wait_mode_ = WaitMode::OnAllAccesses;	break;
								case 1:		wait_mode_ = WaitMode::OnM1;			break;
							}

							// Dave delays (i.e. those affecting memory areas not associated with Nick)
							// are one cycle in 8Mhz mode, two cycles in 12Mhz mode.
							dave_delay_ = HalfCycles(2 + ((*cycle.value)&2));

							[[fallthrough]];

						case 0xa0:	case 0xa1:	case 0xa2:	case 0xa3:
						case 0xa4:	case 0xa5:	case 0xa6:	case 0xa7:
						case 0xa8:	case 0xa9:	case 0xaa:	case 0xab:
						case 0xac:	case 0xad:	case 0xae:	case 0xaf:
							update_audio();
							dave_audio_.write(address, *cycle.value);
							dave_timer_->write(address, *cycle.value);
						break;

						case 0xb4:
							interrupt_mask_ = *cycle.value & 0x55;
							interrupt_state_ &= ~*cycle.value;
							update_interrupts();
						break;
						case 0xb5:
							// Logic here: the ROM scans the keyboard by checking ascending
							// lines. It also seems to provide a line of 0 when using port B5
							// for non-keyboard uses.
							//
							// So: use the rollover from line 9 back to line 0 as a trigger to
							// spot that a scan of the keyboard just finished. Which makes it
							// time to enqueue the next keypress.
							//
							// Re: should_skip_splash_screen_ and typer_delay_, assume that a
							// single keypress is necessary to get past the Enterprise splash
							// screen, then a pause in keypressing while BASIC or whatever
							// starts up, then presses can resume.
							if(active_key_line_ == 9 && !(*cycle.value & 0xf) && (should_skip_splash_screen_ || typer_)) {
								if(should_skip_splash_screen_) {
									set_key_state(uint16_t(Key::Space), typer_delay_);
									if(typer_delay_) {
										--typer_delay_;
									} else {
										typer_delay_ = 60;
										should_skip_splash_screen_ = false;
									}
								} else {
									if(!typer_delay_) {
										if(!typer_->type_next_character()) {
											clear_all_keys();
											typer_ = nullptr;
										}
									} else {
										--typer_delay_;
									}
								}
							}

							active_key_line_ = *cycle.value & 0xf;
							// TODO:
							//
							//	b4:	strobe output for printer
							//	b5:	tape sound control (?)
							//	b6:	tape motor control 1, 1 = on
							//	b7: tape motor control 2, 1 = on
						break;
						case 0xb6:
							// Just 8 bits of printer data.
							logger.info().append("TODO: printer output: %02x", *cycle.value);
						break;
						case 0xb7:
							// b0 = serial data out
							// b1 = serial status out
							logger.info().append("TODO: serial output: %02x", *cycle.value);
						break;
					}
				break;

				case PartialMachineCycle::Read:
				case PartialMachineCycle::ReadOpcode:
					if(read_pointers_[address >> 14]) {
						*cycle.value = read_pointers_[address >> 14][address];
					} else {
						*cycle.value = 0xff;
					}
				break;

				case PartialMachineCycle::Write:
					if(write_pointers_[address >> 14]) {
						write_pointers_[address >> 14][address] = *cycle.value;
					}
				break;
			}

			return penalty;
		}